

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void fiber_init_toplevel(Fiber *fbr)

{
  Fiber *fbr_local;
  
  fbr->stack = (void *)0x0;
  fbr->stack_size = 0xffffffffffffffff;
  fbr->alloc_stack = (void *)0x0;
  memset(fbr,0,0x40);
  fbr->state = 7;
  return;
}

Assistant:

void
fiber_init_toplevel(Fiber *fbr)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    fbr->stack = NULL;
    fbr->stack_size = (size_t) -1;
    fbr->alloc_stack = NULL;
    memset(&fbr->regs, 0, sizeof fbr->regs);
    fbr->state = FIBER_FS_ALIVE | FIBER_FS_TOPLEVEL | FIBER_FS_EXECUTING;
}